

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2contains_point_query.h
# Opt level: O1

bool __thiscall
S2ContainsPointQuery<S2ShapeIndex>::Contains(S2ContainsPointQuery<S2ShapeIndex> *this,S2Point *p)

{
  Iterator *this_00;
  bool bVar1;
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this_01;
  const_reference clipped;
  size_type_conflict n;
  uint uVar2;
  
  this_00 = &this->it_;
  bVar1 = S2ShapeIndex::Iterator::Locate(this_00,p);
  if (bVar1) {
    this_01 = (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
              S2ShapeIndex::Iterator::cell(this_00);
    uVar2 = *(uint *)this_01 & 0xffffff;
    if (uVar2 == 0) {
      return uVar2 != 0;
    }
    n = 0;
    do {
      clipped = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                          (this_01,n);
      bVar1 = ShapeContains(this,this_00,clipped,p);
      if (bVar1) {
        return true;
      }
      n = n + 1;
    } while (uVar2 != n);
  }
  return false;
}

Assistant:

bool S2ContainsPointQuery<IndexType>::Contains(const S2Point& p) {
  if (!it_.Locate(p)) return false;

  const S2ShapeIndexCell& cell = it_.cell();
  int num_clipped = cell.num_clipped();
  for (int s = 0; s < num_clipped; ++s) {
    if (ShapeContains(it_, cell.clipped(s), p)) return true;
  }
  return false;
}